

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase414::run(TestCase414 *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar3;
  long lVar4;
  StringPtr text;
  StringPtr text_00;
  Own<kj::File> dest;
  String bigString;
  Own<kj::File> source;
  TestClock clock;
  Array<char> local_48;
  StringPtr local_30;
  StringPtr local_20;
  
  clock.super_Clock._vptr_Clock = (_func_int **)&PTR_now_00422458;
  clock.time.value.value = (Quantity<long,_kj::_::NanosecondLabel>)1000000000;
  newInMemoryFile((kj *)&source,&clock.super_Clock);
  text.content.size_ = 10;
  text.content.ptr = "foobarbaz";
  File::writeAll(source.ptr,text);
  newInMemoryFile((kj *)&dest,&clock.super_Clock);
  text_00.content.size_ = 9;
  text_00.content.ptr = "quxcorge";
  File::writeAll(dest.ptr,text_00);
  TestClock::expectChanged(&clock,(FsNode *)dest.ptr);
  iVar2 = File::copy(dest.ptr,(EVP_PKEY_CTX *)0x3,(EVP_PKEY_CTX *)source.ptr);
  if ((CONCAT44(extraout_var,iVar2) != 3) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[68]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1a8,ERROR,
               "\"failed: expected \" \"dest->File::copy(3, *source, 6, kj::maxValue) == 3\"",
               (char (*) [68])"failed: expected dest->File::copy(3, *source, 6, kj::maxValue) == 3")
    ;
  }
  TestClock::expectChanged(&clock,(FsNode *)dest.ptr);
  ReadableFile::readAllText(&bigString,&(dest.ptr)->super_ReadableFile);
  local_48.ptr = "quxbazge";
  local_48.size_ = 9;
  bVar1 = String::operator==(&bigString,(StringPtr *)&local_48);
  Array<char>::~Array(&bigString.content);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1aa,ERROR,"\"failed: expected \" \"dest->readAllText() == \\\"quxbazge\\\"\"",
               (char (*) [51])"failed: expected dest->readAllText() == \"quxbazge\"");
  }
  iVar2 = File::copy(dest.ptr,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)source.ptr);
  if ((CONCAT44(extraout_var_00,iVar2) != 4) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1ac,ERROR,"\"failed: expected \" \"dest->File::copy(0, *source, 3, 4) == 4\"",
               (char (*) [57])"failed: expected dest->File::copy(0, *source, 3, 4) == 4");
  }
  TestClock::expectChanged(&clock,(FsNode *)dest.ptr);
  ReadableFile::readAllText(&bigString,&(dest.ptr)->super_ReadableFile);
  local_48.ptr = "barbazge";
  local_48.size_ = 9;
  bVar1 = String::operator==(&bigString,(StringPtr *)&local_48);
  Array<char>::~Array(&bigString.content);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1ae,ERROR,"\"failed: expected \" \"dest->readAllText() == \\\"barbazge\\\"\"",
               (char (*) [51])"failed: expected dest->readAllText() == \"barbazge\"");
  }
  iVar2 = File::copy(dest.ptr,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)source.ptr);
  if ((CONCAT44(extraout_var_01,iVar2) != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[70]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1b0,ERROR,
               "\"failed: expected \" \"dest->File::copy(0, *source, 128, kj::maxValue) == 0\"",
               (char (*) [70])
               "failed: expected dest->File::copy(0, *source, 128, kj::maxValue) == 0");
  }
  TestClock::expectUnchanged(&clock,(FsNode *)dest.ptr);
  pcVar3 = (char *)0x3;
  iVar2 = File::copy(dest.ptr,(EVP_PKEY_CTX *)&DAT_00000004,(EVP_PKEY_CTX *)source.ptr);
  if ((CONCAT44(extraout_var_02,iVar2) != 0) && (_::Debug::minSeverity < 3)) {
    pcVar3 = "\"failed: expected \" \"dest->File::copy(4, *source, 3, 0) == 0\"";
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1b3,ERROR,"\"failed: expected \" \"dest->File::copy(4, *source, 3, 0) == 0\"",
               (char (*) [57])"failed: expected dest->File::copy(4, *source, 3, 0) == 0");
  }
  TestClock::expectUnchanged(&clock,(FsNode *)dest.ptr);
  local_48.ptr = "foobar";
  local_48.size_ = 10000;
  strArray<kj::Repeat<char_const*>>
            (&bigString,(kj *)&local_48,(Repeat<const_char_*> *)0x33812f,pcVar3);
  lVar4 = 0;
  if (bigString.content.size_ != 0) {
    lVar4 = bigString.content.size_ - 1;
  }
  (*((source.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[0xb])(source.ptr,lVar4 + 1000);
  pcVar3 = (char *)bigString.content.size_;
  if (bigString.content.size_ != 0) {
    pcVar3 = bigString.content.ptr;
  }
  lVar4 = 0;
  if (bigString.content.size_ != 0) {
    lVar4 = bigString.content.size_ - 1;
  }
  (*((source.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[9])(source.ptr,0x7b,pcVar3,lVar4);
  File::copy(dest.ptr,(EVP_PKEY_CTX *)0x141,(EVP_PKEY_CTX *)source.ptr);
  ReadableFile::readAllText((String *)&local_48,&(dest.ptr)->super_ReadableFile);
  local_30.content.ptr = "";
  if (local_48.size_ != 0) {
    local_30.content.ptr = local_48.ptr;
  }
  local_30.content.size_ = (local_48.size_ - 0x141) + (ulong)(local_48.size_ == 0);
  local_30.content.ptr = local_30.content.ptr + 0x141;
  local_20.content.ptr = "";
  if (bigString.content.size_ != 0) {
    local_20.content.ptr = bigString.content.ptr;
  }
  local_20.content.size_ = bigString.content.size_ + (bigString.content.size_ == 0);
  bVar1 = StringPtr::operator==(&local_30,&local_20);
  Array<char>::~Array(&local_48);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1bb,ERROR,"\"failed: expected \" \"dest->readAllText().slice(321) == bigString\"",
               (char (*) [61])"failed: expected dest->readAllText().slice(321) == bigString");
  }
  Array<char>::~Array(&bigString.content);
  Own<kj::File>::dispose(&dest);
  Own<kj::File>::dispose(&source);
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }